

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringize.h
# Opt level: O2

string * __thiscall
snowhouse::detail::DefaultStringizer<bool,true>::ToString_abi_cxx11_
          (string *__return_storage_ptr__,DefaultStringizer<bool,true> *this,bool *value)

{
  ostringstream buf;
  ostringstream local_190 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::ostream::_M_insert<bool>(SUB81(local_190,0));
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

static std::string ToString(const T& value)
      {
        std::ostringstream buf;
        buf << value;
        return buf.str();
      }